

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

int64 osc::ToInt64(char *p)

{
  anon_union_8_2_94730047 u;
  char *p_local;
  
  return CONCAT17(*p,CONCAT16(p[1],CONCAT15(p[2],CONCAT14(p[3],CONCAT13(p[4],CONCAT12(p[5],CONCAT11(
                                                  p[6],p[7])))))));
}

Assistant:

static inline int64 ToInt64( const char *p )
{
#ifdef OSC_HOST_LITTLE_ENDIAN
    union{
        osc::int64 i;
        char c[8];
    } u;

    u.c[0] = p[7];
    u.c[1] = p[6];
    u.c[2] = p[5];
    u.c[3] = p[4];
    u.c[4] = p[3];
    u.c[5] = p[2];
    u.c[6] = p[1];
    u.c[7] = p[0];

    return u.i;
#else
	return *(int64*)p;
#endif
}